

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MppCluster * __thiscall MppClusterServer::get(MppClusterServer *this,MppClientType client_type)

{
  ulong uVar1;
  uint uVar2;
  RK_U32 RVar3;
  MppCluster *cluster;
  ClusterWorker *pCVar4;
  long lVar5;
  long lVar6;
  AutoMutex auto_lock;
  
  uVar1 = (ulong)client_type;
  if ((int)client_type < 0x1e) {
    auto_lock.mEnabled = 1;
    auto_lock.mLock = &this->super_Mutex;
    pthread_mutex_lock((pthread_mutex_t *)this);
    cluster = this->mClusters[uVar1];
    if (cluster == (MppCluster *)0x0) {
      cluster = (MppCluster *)mpp_osal_malloc("get",0x80);
      if (cluster == (MppCluster *)0x0) {
        cluster = (MppCluster *)0x0;
      }
      else {
        mpp_cluster_queue_init(cluster->queue,cluster);
        uVar2 = getpid();
        cluster->pid = uVar2;
        cluster->client_type = client_type;
        snprintf((char *)cluster,0xf,"%d:%d",(ulong)uVar2,uVar1);
        cluster->node_id = 0;
        cluster->worker_id = 0;
        cluster->worker_func = cluster_worker;
        RVar3 = mpp_cluster_thd_cnt;
        cluster->worker_count = mpp_cluster_thd_cnt;
        if ((int)RVar3 < 1) {
          _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "p->worker_count > 0","get",0x292);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
            abort();
          }
          RVar3 = cluster->worker_count;
        }
        pCVar4 = (ClusterWorker *)mpp_osal_malloc("get",(long)(int)RVar3 * 0x58);
        cluster->worker = pCVar4;
        lVar5 = 0;
        for (lVar6 = 0; lVar6 < cluster->worker_count; lVar6 = lVar6 + 1) {
          cluster_worker_init((ClusterWorker *)(cluster->worker->name + lVar5),cluster);
          lVar5 = lVar5 + 0x58;
        }
        this->mClusters[uVar1] = cluster;
        if (((byte)mpp_cluster_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_cluster","%s created\n",(char *)0x0,cluster);
        }
      }
    }
    Mutex::Autolock::~Autolock(&auto_lock);
    if (cluster != (MppCluster *)0x0) {
      if (((byte)mpp_cluster_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_cluster","%s get\n",(char *)0x0,cluster);
        return cluster;
      }
      return cluster;
    }
  }
  if (((byte)mpp_cluster_debug & 1) != 0) {
    uVar2 = getpid();
    _mpp_log_l(4,"mpp_cluster","%d get cluster %d failed\n",(char *)0x0,(ulong)uVar2,uVar1);
  }
  return (MppCluster *)0x0;
}

Assistant:

MppCluster *MppClusterServer::get(MppClientType client_type)
{
    RK_S32 i;
    MppCluster *p = NULL;

    if (client_type >= VPU_CLIENT_BUTT)
        goto done;

    {
        AutoMutex auto_lock(this);

        p = mClusters[client_type];
        if (p)
            goto done;

        p = mpp_malloc(MppCluster, 1);
        if (p) {
            for (i = 0; i < MAX_PRIORITY; i++)
                mpp_cluster_queue_init(&p->queue[i], p);

            p->pid  = getpid();
            p->client_type = client_type;
            snprintf(p->name, sizeof(p->name) - 1, "%d:%d", p->pid, client_type);
            p->node_id = 0;
            p->worker_id = 0;
            p->worker_func = cluster_worker;
            p->worker_count = mpp_cluster_thd_cnt;

            mpp_assert(p->worker_count > 0);

            p->worker = mpp_malloc(ClusterWorker, p->worker_count);

            for (i = 0; i < p->worker_count; i++)
                cluster_worker_init(&p->worker[i], p);

            mClusters[client_type] = p;
            cluster_dbg_flow("%s created\n", p->name);
        }
    }

done:
    if (p)
        cluster_dbg_flow("%s get\n", p->name);
    else
        cluster_dbg_flow("%d get cluster %d failed\n", getpid(), client_type);

    return p;
}